

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O0

ON_SubDVertexSurfacePointCoefficient *
ON_SubDVertexSurfacePointCoefficient::Create
          (ON_SubDVertexSurfacePointCoefficient *__return_storage_ptr__,
          ON_SubDVertex *limit_point_vertex,ON_SubDVertex *ring_vertex,double x)

{
  ON_SubDVertexSurfacePointCoefficient *c;
  double x_local;
  ON_SubDVertex *ring_vertex_local;
  ON_SubDVertex *limit_point_vertex_local;
  
  ON_SubDVertexSurfacePointCoefficient(__return_storage_ptr__);
  __return_storage_ptr__->m_limit_point_vertex = limit_point_vertex;
  __return_storage_ptr__->m_ring_vertex = ring_vertex;
  __return_storage_ptr__->m_c = x;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDVertexSurfacePointCoefficient ON_SubDVertexSurfacePointCoefficient::Create(
  const ON_SubDVertex* limit_point_vertex,
  const ON_SubDVertex* ring_vertex,
  double x
)
{
  ON_SubDVertexSurfacePointCoefficient c;
  c.m_limit_point_vertex = limit_point_vertex;
  c.m_ring_vertex = ring_vertex;
  c.m_c = x;
  //DebugAt(c)
  return c;
}